

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationPrimitiveDiscardTests.cpp
# Opt level: O0

bool vkt::tessellation::anon_unknown_0::lessThanOneInnerLevelsDefined(CaseDefinition *caseDef)

{
  bool local_11;
  CaseDefinition *caseDef_local;
  
  if (((caseDef->primitiveType == TESSPRIMITIVETYPE_QUADS) ||
      (local_11 = false, caseDef->primitiveType == TESSPRIMITIVETYPE_TRIANGLES)) &&
     (local_11 = false, (caseDef->usePointMode & 1U) != 0)) {
    local_11 = caseDef->spacingMode == SPACINGMODE_FRACTIONAL_ODD;
  }
  return (bool)((local_11 ^ 0xffU) & 1);
}

Assistant:

bool lessThanOneInnerLevelsDefined (const CaseDefinition& caseDef)
{
	// From Vulkan API specification:
	// >> When tessellating triangles or quads in point mode with fractional odd spacing, the tessellator
	// >> ***may*** produce interior vertices that are positioned on the edge of the patch if an inner
	// >> tessellation level is less than or equal to one.
	return !((caseDef.primitiveType == vkt::tessellation::TESSPRIMITIVETYPE_QUADS      ||
			  caseDef.primitiveType == vkt::tessellation::TESSPRIMITIVETYPE_TRIANGLES) &&
			 caseDef.usePointMode                                                     &&
			 caseDef.spacingMode == vkt::tessellation::SPACINGMODE_FRACTIONAL_ODD);
}